

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void __thiscall Imf_3_4::IDManifest::IDManifest(IDManifest *this,CompressedIDManifest *compressed)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  InputExc *pIVar4;
  EVP_PKEY_CTX *ctx;
  int *in_RSI;
  IDManifest *in_RDI;
  size_t inSize;
  size_t outSize;
  vector<char,_std::allocator<char>_> uncomp;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  long local_48 [3];
  allocator<char> local_29;
  vector<char,_std::allocator<char>_> local_28;
  int *local_10;
  
  local_10 = in_RSI;
  std::
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ::vector((vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            *)0x1e3bc1);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<char>::~allocator(&local_29);
  iVar2 = *local_10;
  uVar1 = *(undefined8 *)(local_10 + 4);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1e3c42);
  iVar2 = exr_uncompress_buffer(0,uVar1,(long)iVar2,pcVar3,*(undefined8 *)(local_10 + 2),local_48);
  if (iVar2 != 0) {
    pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(pIVar4,"IDManifest decompression (zlib) failed.");
    __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  if (local_48[0] != *(long *)(local_10 + 2)) {
    pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc
              (pIVar4,"IDManifest decompression (zlib) failed: mismatch in decompressed data size");
    __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  ctx = (EVP_PKEY_CTX *)std::vector<char,_std::allocator<char>_>::operator[](&local_28,0);
  std::vector<char,_std::allocator<char>_>::operator[](&local_28,0);
  init(in_RDI,ctx);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)ctx);
  return;
}

Assistant:

IDManifest::IDManifest (const CompressedIDManifest& compressed)
{
    //
    // decompress the compressed manifest
    //

    vector<char> uncomp (compressed._uncompressedDataSize);
    size_t       outSize;
    size_t       inSize = static_cast<size_t> (compressed._compressedDataSize);
    if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                               nullptr,
                               compressed._data,
                               inSize,
                               uncomp.data (),
                               compressed._uncompressedDataSize,
                               &outSize))
    {
        throw IEX_NAMESPACE::InputExc (
            "IDManifest decompression (zlib) failed.");
    }
    if (outSize != compressed._uncompressedDataSize)
    {
        throw IEX_NAMESPACE::InputExc (
            "IDManifest decompression (zlib) failed: mismatch in decompressed data size");
    }

    init ((const char*) &uncomp[0], (const char*) &uncomp[0] + outSize);
}